

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab7.c
# Opt level: O0

int FeedFromArray(void)

{
  FILE *__stream;
  bool bVar1;
  int local_1c;
  int i;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    if (-1 < testInOut[testN].N) {
      fprintf(__stream,"%d\n",(ulong)(uint)testInOut[testN].N);
    }
    if (-1 < testInOut[testN].M) {
      fprintf(__stream,"%d\n",(ulong)(uint)testInOut[testN].M);
    }
    local_1c = 0;
    while( true ) {
      bVar1 = false;
      if (local_1c < testInOut[testN].M) {
        bVar1 = *(int *)((long)testN * 0xf0 + 0x1063a8 + (long)local_1c * 8) != 0;
      }
      if (!bVar1) break;
      fprintf(__stream,"%d %d\n",
              (ulong)*(uint *)((long)testN * 0xf0 + 0x1063a8 + (long)local_1c * 8),
              (ulong)*(uint *)((long)testN * 0xf0 + 0x1063ac + (long)local_1c * 8));
      local_1c = local_1c + 1;
    }
    fclose(__stream);
    LabMemoryLimit = (long)(testInOut[testN].N * 10 + testInOut[testN].M * 2) + 0x400000;
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int FeedFromArray(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    if (testInOut[testN].N >= 0) {
        fprintf(in, "%d\n", testInOut[testN].N);
    }
    if (testInOut[testN].M >= 0) {
        fprintf(in, "%d\n", testInOut[testN].M);
    }
    for (i = 0; i < testInOut[testN].M && testInOut[testN].G[i].a != 0; i++) {
        fprintf(in, "%d %d\n", testInOut[testN].G[i].a, testInOut[testN].G[i].b);
    }
    fclose(in);
    LabMemoryLimit = testInOut[testN].N * 10 + testInOut[testN].M * 2 + MIN_PROCESS_RSS_BYTES;
    return 0;
}